

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# degree.cpp
# Opt level: O1

void degree(void)

{
  pointer ppVar1;
  pointer *ppiVar2;
  mapped_type *pmVar3;
  ostream *this;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> degree;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_60;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
  local_48;
  
  freopen("degree.txt","w",_stdout);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&local_60,(long)V,(allocator_type *)&local_48);
  ppVar1 = local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < V) {
    ppiVar2 = &((edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
    lVar5 = 0;
    do {
      local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5].first =
           (int)((ulong)((long)*ppiVar2 - (long)((_Vector_impl_data *)(ppiVar2 + -1))->_M_start) >>
                2);
      local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar5].second = (int)lVar5;
      lVar5 = lVar5 + 1;
      ppiVar2 = ppiVar2 + 3;
    } while (lVar5 < V);
  }
  if (local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = (long)local_60.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_60.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::pair<int,_int>_>
    ::_Temporary_buffer(&local_48,
                        (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         )local_60.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
    if (local_48._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar1,local_60.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar1,local_60.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,local_48._M_buffer,
                 local_48._M_len);
    }
    operator_delete(local_48._M_buffer);
  }
  uVar6 = (ulong)(uint)V;
  lVar5 = uVar6 * 8 + -4;
  for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
    pmVar3 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,
                          (key_type *)
                          ((long)&(local_60.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar5));
    this = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this,": ",2);
    plVar4 = (long *)std::ostream::operator<<
                               (this,local_60.
                                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar6 - 1].first);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    lVar5 = lVar5 + -8;
    std::ostream::flush();
  }
  if (local_60.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<int,_int> *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void degree() {
    freopen("degree.txt", "w", stdout); // output file

    vector< pair<int,int> > degree(V);
    for (int i = 0; i < V; i++) {
        degree[i] = make_pair(edge[i].size(), i);
    }

    stable_sort(degree.begin(), degree.end());

    for (int i = V-1; i >= 0; i--) {
        cout << name[degree[i].second] << ": " << degree[i].first << endl;
    }
}